

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::Response::~Response(Response *this)

{
  bool bVar1;
  function<void_(bool)> *in_RDI;
  undefined1 in_stack_ffffffffffffffef;
  
  bVar1 = std::function::operator_cast_to_bool((function<void_(bool)> *)0x1a36ff);
  if (bVar1) {
    std::function<void_(bool)>::operator()(in_RDI,(bool)in_stack_ffffffffffffffef);
  }
  std::function<void_(bool)>::~function((function<void_(bool)> *)0x1a3738);
  std::function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)>::~function
            ((function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)0x1a3749);
  std::__cxx11::string::~string((string *)&in_RDI[4]._M_invoker);
  std::__cxx11::string::~string((string *)&in_RDI[3]._M_invoker);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x1a3776);
  std::__cxx11::string::~string
            ((string *)(in_RDI[1].super__Function_base._M_functor._M_pod_data + 8));
  std::__cxx11::string::~string((string *)in_RDI);
  return;
}

Assistant:

~Response() {
    if (content_provider_resource_releaser_) {
      content_provider_resource_releaser_(content_provider_success_);
    }
  }